

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_glows.cxx
# Opt level: O2

void __thiscall xray_re::xr_glow_object::save(xr_glow_object *this,xr_writer *w)

{
  undefined1 local_14 [4];
  
  xr_custom_object::save(&this->super_xr_custom_object,w);
  xr_writer::w_chunk<unsigned_short>(w,0xc411,&GLOW_VERSION);
  xr_writer::open_chunk(w,0xc413);
  (*w->_vptr_xr_writer[2])(w,local_14,4);
  xr_writer::close_chunk(w);
  xr_writer::w_chunk(w,0xc414,&this->m_shader);
  xr_writer::w_chunk(w,0xc415,&this->m_texture);
  xr_writer::w_chunk<unsigned_short>(w,0xc416,&this->m_flags);
  return;
}

Assistant:

void xr_glow_object::save(xr_writer& w) const
{
	xr_custom_object::save(w);

	w.w_chunk<uint16_t>(GLOW_CHUNK_VERSION, GLOW_VERSION);

	w.open_chunk(GLOW_CHUNK_PARAMS);
	w.w_float(m_radius);
	w.close_chunk();

	w.w_chunk(GLOW_CHUNK_SHADER, m_shader);
	w.w_chunk(GLOW_CHUNK_TEXTURE, m_texture);

	w.w_chunk<uint16_t>(GLOW_CHUNK_FLAGS, m_flags);
}